

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int32_t iVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int i;
  int iVar8;
  char *__format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  FILE *pFVar10;
  undefined8 in_R9;
  allocator<char> local_899;
  whisper_params params;
  whisper_context_params cparams;
  string arg;
  
  whisper_params::whisper_params(&params);
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[iVar8],(allocator<char> *)&cparams);
    pbVar9 = &arg;
    bVar2 = std::operator==(&arg,"-h");
    iVar5 = (int)pbVar9;
    if (bVar2) {
LAB_0010298c:
      whisper_print_usage(iVar5,argv,&params);
      exit(0);
    }
    pbVar9 = &arg;
    bVar2 = std::operator==(&arg,"--help");
    iVar5 = (int)pbVar9;
    if (bVar2) goto LAB_0010298c;
    bVar2 = std::operator==(&arg,"-t");
    if ((bVar2) || (bVar2 = std::operator==(&arg,"--threads"), bVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cparams,argv[(long)iVar8 + 1],&local_899);
      params.n_threads = std::__cxx11::stoi((string *)&cparams,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&cparams);
      iVar8 = iVar8 + 1;
    }
    else {
      bVar2 = std::operator==(&arg,"-m");
      if ((bVar2) || (bVar2 = std::operator==(&arg,"--model"), bVar2)) {
        std::__cxx11::string::assign((char *)&params.model);
        iVar8 = iVar8 + 1;
      }
      else {
        bVar2 = std::operator==(&arg,"-w");
        if ((bVar2) || (bVar2 = std::operator==(&arg,"--what"), bVar2)) {
          params.what = atoi(argv[(long)iVar8 + 1]);
          iVar8 = iVar8 + 1;
        }
        else {
          bVar2 = std::operator==(&arg,"-ng");
          if ((bVar2) || (bVar2 = std::operator==(&arg,"--no-gpu"), bVar2)) {
            params._40_2_ = params._40_2_ & 0xff00;
          }
          else {
            bVar2 = std::operator==(&arg,"-fa");
            if ((!bVar2) && (bVar2 = std::operator==(&arg,"--flash-attn"), !bVar2)) {
              pFVar10 = _stderr;
              fprintf(_stderr,"error: unknown argument: %s\n",arg._M_dataplus._M_p);
              iVar5 = (int)pFVar10;
              goto LAB_0010298c;
            }
            params.flash_attn = true;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&arg);
  }
  if (params.what == 1) {
    iVar8 = whisper_bench_memcpy(params.n_threads);
    goto LAB_00102632;
  }
  if (params.what == 2) {
    iVar8 = whisper_bench_ggml_mul_mat(params.n_threads);
    goto LAB_00102632;
  }
  if (params.what != 0) {
    fprintf(_stderr,"error: unknown benchmark: %d\n");
    iVar8 = -1;
    goto LAB_00102632;
  }
  whisper_context_default_params(&cparams);
  cparams.use_gpu = params.use_gpu;
  cparams.flash_attn = params.flash_attn;
  uVar4 = cparams._0_4_;
  lVar6 = whisper_init_from_file_with_params(params.model._M_dataplus._M_p);
  fputc(10,_stderr);
  iVar1 = params.n_threads;
  pFVar10 = _stderr;
  uVar3 = std::thread::hardware_concurrency();
  uVar7 = whisper_print_system_info();
  fprintf(pFVar10,"system_info: n_threads = %d / %d | %s\n",(ulong)(uint)iVar1,(ulong)uVar3,uVar7,
          in_R9,uVar4,cparams._8_4_,cparams.dtw_n_top,(undefined4)cparams.dtw_aheads.n_heads,
          cparams.dtw_aheads.heads._0_4_,(undefined4)cparams.dtw_mem_size);
  if (lVar6 == 0) {
    fwrite("error: failed to initialize whisper context\n",0x2c,1,_stderr);
    iVar8 = 2;
    goto LAB_00102632;
  }
  uVar4 = whisper_model_n_mels(lVar6);
  uVar3 = whisper_set_mel(lVar6,0,0,uVar4);
  if (uVar3 != 0) {
    fprintf(_stderr,"error: failed to set mel: %d\n",(ulong)uVar3);
    iVar8 = 3;
    goto LAB_00102632;
  }
  iVar8 = whisper_encode(lVar6,0,params.n_threads);
  if (iVar8 == 0) {
    memset(&arg,0,0x800);
    iVar8 = whisper_decode(lVar6,&arg,0x100,0,params.n_threads);
    if ((iVar8 == 0) && (iVar8 = whisper_decode(lVar6,&arg,1,0x100,params.n_threads), iVar8 == 0)) {
      whisper_reset_timings(lVar6);
      iVar8 = whisper_encode(lVar6,0,params.n_threads);
      if (iVar8 != 0) goto LAB_00102812;
      iVar8 = 0;
      do {
        if (iVar8 == 0x100) {
          iVar8 = 0x41;
          goto LAB_0010282e;
        }
        iVar5 = whisper_decode(lVar6,&arg,1,iVar8,params.n_threads);
        iVar8 = iVar8 + 1;
      } while (iVar5 == 0);
    }
    goto LAB_00102877;
  }
LAB_00102812:
  __format = "error: failed to encode: %d\n";
  goto LAB_00102882;
  while (iVar5 = whisper_decode(lVar6,&arg,5,0,params.n_threads), iVar5 == 0) {
LAB_0010282e:
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      iVar8 = 0x11;
      goto LAB_00102858;
    }
  }
  goto LAB_00102877;
  while (iVar5 = whisper_decode(lVar6,&arg,0x100,0,params.n_threads), iVar5 == 0) {
LAB_00102858:
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      whisper_print_timings(lVar6);
      whisper_free(lVar6);
      fputc(10,_stderr);
      fwrite("If you wish, you can submit these results here:\n",0x30,1,_stderr);
      fputc(10,_stderr);
      fwrite("  https://github.com/ggerganov/whisper.cpp/issues/89\n",0x35,1,_stderr);
      fputc(10,_stderr);
      fwrite("Please include the following information:\n",0x2a,1,_stderr);
      fputc(10,_stderr);
      fwrite("  - CPU model\n",0xe,1,_stderr);
      fwrite("  - Operating system\n",0x15,1,_stderr);
      fwrite("  - Compiler\n",0xd,1,_stderr);
      fputc(10,_stderr);
      iVar8 = 0;
      goto LAB_00102632;
    }
  }
LAB_00102877:
  __format = "error: failed to decode: %d\n";
LAB_00102882:
  fprintf(_stderr,__format,1);
  iVar8 = 4;
LAB_00102632:
  std::__cxx11::string::~string((string *)&params.model);
  return iVar8;
}

Assistant:

int main(int argc, char ** argv) {
    whisper_params params;

    if (whisper_params_parse(argc, argv, params) == false) {
        return 1;
    }

    int ret = -1;

    switch (params.what) {
        case 0: ret = whisper_bench_full(params);                break;
        case 1: ret = whisper_bench_memcpy(params.n_threads);       break;
        case 2: ret = whisper_bench_ggml_mul_mat(params.n_threads); break;
        default: fprintf(stderr, "error: unknown benchmark: %d\n", params.what); break;
    }

    return ret;
}